

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

void Flatten(ON_PolyCurve *poly,ON_Interval pdom,ON_SimpleArray<double> *new_t,
            ON_SimpleArray<ON_Curve_*> *new_seg)

{
  uint uVar1;
  double *pdVar2;
  ON_PolyCurve *poly_00;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double t1;
  double local_78;
  double local_70;
  ON_Curve *seg;
  ON_Interval local_60;
  ON_Interval pcdom;
  ON_Interval pdom_local;
  
  dVar5 = pdom.m_t[1];
  pdom_local.m_t[0] = pdom.m_t[0];
  uVar1 = (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar4 = 0;
  pdom_local.m_t[1] = dVar5;
  pdVar2 = ON_Interval::operator[](&pdom_local,0);
  local_70 = *pdVar2;
  (*(poly->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(poly);
  uVar3 = (ulong)uVar1;
  pcdom.m_t[1] = dVar5;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    _t1 = ON_PolyCurve::SegmentDomain(poly,(int)uVar4);
    pdVar2 = ON_Interval::operator[]((ON_Interval *)&t1,1);
    dVar5 = ON_Interval::NormalizedParameterAt(&pcdom,*pdVar2);
    dVar5 = ON_Interval::ParameterAt(&pdom_local,dVar5);
    t1 = dVar5;
    if ((long)uVar4 < (long)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
      seg = (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4];
    }
    else {
      seg = (ON_Curve *)0x0;
    }
    poly_00 = ON_PolyCurve::Cast((ON_Object *)seg);
    if (poly_00 == (ON_PolyCurve *)0x0) {
      ON_SimpleArray<double>::Append(new_t,&t1);
      ON_SimpleArray<ON_Curve_*>::Append(new_seg,&seg);
      if ((long)uVar4 < (long)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
        (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4] = (ON_Curve *)0x0;
      }
    }
    else {
      ON_Interval::ON_Interval(&local_60,local_70,t1);
      Flatten(poly_00,local_60,new_t,new_seg);
      if ((long)uVar4 < (long)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
        (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4] = (ON_Curve *)0x0;
      }
      (*(poly_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(poly_00);
    }
    local_70 = t1;
  }
  return;
}

Assistant:

static
void Flatten( ON_PolyCurve* poly, ON_Interval pdom, ON_SimpleArray<double>& new_t, ON_SimpleArray<ON_Curve*>& new_seg){
		int n= poly->Count();
		double t0 = pdom[0];
		ON_Interval pcdom = poly->Domain();
		for(int i=0; i<n; i++){
			double sdom=poly->SegmentDomain(i)[1];
			double ndom=pcdom.NormalizedParameterAt(sdom);	
			double t1 =pdom.ParameterAt(ndom);
			ON_Curve* seg = poly->SegmentCurve(i);
			ON_PolyCurve* spoly =  ON_PolyCurve::Cast(seg);
			if(spoly){
				Flatten(spoly, ON_Interval(t0,t1), new_t, new_seg );
				poly->HarvestSegment(i);		
				delete spoly;
			} else {
				new_t.Append(t1);
				new_seg.Append(seg);
				poly->HarvestSegment(i);
			}
			t0 = t1;
		}
}